

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BandedAlign.h
# Opt level: O1

int __thiscall
BandedAlign<Protein>::Align
          (BandedAlign<Protein> *this,Sequence<Protein> *A,Sequence<Protein> *B,Cigar *cigar,
          AlignmentDirection dir,size_t startA,size_t startB,size_t endA,size_t endB)

{
  pointer piVar1;
  pointer pCVar2;
  int *piVar3;
  BandedAlignParams *pBVar4;
  bool bVar5;
  CigarOp CVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  bool *pbVar13;
  pointer pGVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  size_t length;
  deque<CigarEntry,_std::allocator<CigarEntry>_> *this_00;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  value_type local_148;
  pointer local_138;
  ulong local_130;
  ulong local_128;
  pointer local_120;
  pointer local_118;
  ulong local_110;
  ulong local_108;
  Sequence<Protein> *local_100;
  Sequence<Protein> *local_f8;
  long local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  undefined8 uStack_d0;
  ulong local_c0;
  size_t local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  vector<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_> local_98;
  pointer local_78;
  ulong local_70;
  AlignmentDirection local_64;
  int *local_60;
  deque<CigarEntry,_std::allocator<CigarEntry>_> *local_58;
  ulong local_50;
  ulong local_48;
  allocator_type local_3c;
  byte local_3b;
  bool local_3a;
  bool local_39;
  BandedAlign<Protein> *local_38;
  
  uVar10 = (A->sequence)._M_string_length;
  uVar16 = (B->sequence)._M_string_length;
  uVar17 = 0;
  uVar11 = 0;
  if (dir == Forward) {
    uVar17 = uVar16;
    uVar11 = uVar10;
  }
  if (endA != 0xffffffffffffffff) {
    uVar11 = endA;
  }
  if (endB != 0xffffffffffffffff) {
    uVar17 = endB;
  }
  local_b0 = startA;
  if (uVar10 < startA) {
    local_b0 = uVar10;
  }
  local_a0 = startB;
  if (uVar16 < startB) {
    local_a0 = uVar16;
  }
  local_60 = (int *)uVar10;
  if (uVar11 < uVar10) {
    local_60 = (int *)uVar11;
  }
  local_48 = uVar16;
  if (uVar17 < uVar16) {
    local_48 = uVar17;
  }
  local_c0 = local_b0 - (long)local_60;
  if (startA < local_60) {
    local_c0 = (long)local_60 - local_b0;
  }
  local_e0 = local_a0 - local_48;
  if (startB < local_48) {
    local_e0 = local_48 - local_a0;
  }
  local_50 = local_c0 + 1;
  uVar7 = local_50;
  local_100 = B;
  local_f8 = A;
  local_64 = dir;
  local_58 = &cigar->super_deque<CigarEntry,_std::allocator<CigarEntry>_>;
  local_38 = this;
  if ((ulong)((long)(this->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage -
              (long)(this->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) < local_50) {
    uStack_d0 = 0;
    auVar22._8_4_ = (int)(local_50 >> 0x20);
    auVar22._0_8_ = local_50;
    auVar22._12_4_ = 0x45300000;
    dVar24 = ((auVar22._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_50) - 4503599627370496.0)) * 1.5;
    uVar7 = (ulong)dVar24;
    local_148.mScore = -0x40000000;
    local_d8 = local_50;
    local_b8 = startA;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_98,
               (long)(dVar24 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7,
               &local_148.mScore,&local_3c);
    piVar1 = (local_38->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    (local_38->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         &(local_98.
           super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
           ._M_impl.super__Vector_impl_data._M_start)->mScore;
    (local_38->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         &(local_98.
           super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
           ._M_impl.super__Vector_impl_data._M_finish)->mScore;
    (local_38->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         &(local_98.
           super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage)->mScore;
    local_98.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (piVar1 != (pointer)0x0) {
      operator_delete(piVar1);
    }
    startA = local_b8;
    uVar7 = local_d8;
    if ((CigarEntry)
        local_98.
        super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
        _M_impl.super__Vector_impl_data._M_start != (CigarEntry)0x0) {
      operator_delete(local_98.
                      super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      startA = local_b8;
      uVar7 = local_d8;
    }
  }
  local_70 = local_e0 + 1;
  if ((ulong)((long)(local_38->mVerticalGaps).
                    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)(local_38->mVerticalGaps).
                    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) < local_50) {
    auVar25._8_4_ = (int)(uVar7 >> 0x20);
    auVar25._0_8_ = uVar7;
    auVar25._12_4_ = 0x45300000;
    dVar24 = ((auVar25._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) * 1.5;
    uVar7 = (ulong)dVar24;
    local_148.mParams = &local_38->mParams;
    local_148.mScore = -0x40000000;
    local_148.mIsTerminal = false;
    std::vector<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>::vector
              (&local_98,(long)(dVar24 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7,
               &local_148,(allocator_type *)&local_3c);
    pGVar14 = (local_38->mVerticalGaps).
              super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
              ._M_impl.super__Vector_impl_data._M_start;
    (local_38->mVerticalGaps).
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_98.
         super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (local_38->mVerticalGaps).
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_98.
         super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (local_38->mVerticalGaps).
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_98.
         super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pGVar14 != (pointer)0x0) {
      operator_delete(pGVar14);
    }
    if ((CigarEntry)
        local_98.
        super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
        _M_impl.super__Vector_impl_data._M_start != (CigarEntry)0x0) {
      operator_delete(local_98.
                      super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  uVar7 = local_70 * local_50;
  if ((ulong)((long)(local_38->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)(local_38->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>.
                   _M_impl.super__Vector_impl_data._M_start) < uVar7) {
    auVar23._8_4_ = (int)(uVar7 >> 0x20);
    auVar23._0_8_ = uVar7;
    auVar23._12_4_ = 0x45300000;
    dVar24 = ((auVar23._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) * 1.5;
    uVar7 = (ulong)dVar24;
    std::vector<CigarOp,_std::allocator<CigarOp>_>::vector
              ((vector<CigarOp,_std::allocator<CigarOp>_> *)&local_98,
               (long)(dVar24 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7,
               (allocator_type *)&local_148);
    pCVar2 = (local_38->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
             super__Vector_impl_data._M_start;
    (local_38->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)local_98.
                  super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (local_38->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_98.
                  super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (local_38->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)local_98.
                  super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pCVar2 != (pointer)0x0) {
      operator_delete(pCVar2);
    }
    if ((CigarEntry)
        local_98.
        super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
        _M_impl.super__Vector_impl_data._M_start != (CigarEntry)0x0) {
      operator_delete(local_98.
                      super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  piVar3 = (local_38->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_e8 = (local_38->mParams).bandwidth;
  bVar5 = uVar16 <= startB || local_a0 == 0;
  local_d8 = CONCAT71(local_d8._1_7_,local_60 == (int *)0x0);
  local_3a = uVar10 <= uVar11;
  local_39 = uVar16 <= uVar17;
  *piVar3 = 0;
  local_78 = (local_38->mVerticalGaps).
             super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
             ._M_impl.super__Vector_impl_data._M_start;
  iVar18 = -0x40000000;
  local_78->mScore = -0x40000000;
  local_78->mIsTerminal = false;
  pBVar4 = local_78->mParams;
  uVar16 = (ulong)bVar5;
  iVar12 = (&pBVar4->interiorGapOpenScore)[uVar16 * 2] + *piVar3 +
           (&pBVar4->interiorGapExtendScore)[uVar16 * 2];
  iVar15 = pBVar4->interiorGapExtendScore + -0x40000000;
  local_78->mScore = iVar15;
  if (iVar15 < iVar12) {
    local_78->mScore = iVar12;
    local_78->mIsTerminal = bVar5;
  }
  if (local_50 < 2) {
    uVar19 = 0;
    uVar10 = 1;
  }
  else {
    bVar5 = uVar10 <= startA || local_b0 == 0;
    uVar11 = (ulong)((uint)bVar5 * 8);
    pCVar2 = (local_38->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar13 = &local_78[1].mIsTerminal;
    uVar19 = 0;
    uVar16 = 1;
    do {
      if ((local_e8 < uVar16) && (1 < local_70)) {
        piVar3[uVar16] = -0x40000000;
        ((Gap *)(pbVar13 + -4))->mScore = -0x40000000;
        *pbVar13 = false;
        uVar10 = uVar16;
        break;
      }
      iVar12 = *(int *)((long)&(local_38->mParams).interiorGapOpenScore + uVar11) +
               piVar3[uVar16 - 1] +
               *(int *)((long)&(local_38->mParams).interiorGapExtendScore + uVar11);
      iVar15 = iVar18 + (&(local_38->mParams).interiorGapExtendScore)[(ulong)uVar19 * 2];
      iVar18 = iVar15;
      if (iVar15 < iVar12) {
        iVar18 = iVar12;
      }
      if (iVar15 < iVar12) {
        uVar19 = (uint)bVar5;
      }
      piVar3[uVar16] = iVar18;
      pCVar2[uVar16] = Insertion;
      ((Gap *)(pbVar13 + -4))->mScore = -0x40000000;
      *pbVar13 = false;
      pbVar13 = pbVar13 + 0x10;
      uVar10 = uVar16 + 1;
      bVar21 = uVar16 != local_c0;
      uVar16 = uVar10;
    } while (bVar21);
  }
  uVar16 = 1;
  if (1 < local_70) {
    local_3a = local_3a || local_60 == (int *)0x0;
    local_39 = local_39 || local_48 == 0;
    local_f0 = local_a0 - 1;
    uVar11 = local_50;
    do {
      local_110 = uVar11;
      local_a8 = uVar16;
      local_108 = local_a8 - local_e8;
      if (local_a8 < local_e8) {
        local_108 = 0;
      }
      if (local_c0 < local_108) {
        local_108 = local_c0;
      }
      uVar16 = local_e8 + local_a8;
      local_48 = uVar16;
      if (local_c0 < uVar16) {
        local_48 = local_c0;
      }
      iVar12 = -0x40000000;
      if (local_108 != 0) {
        iVar12 = piVar3[local_108 - 1];
        piVar3[local_108 - 1] = -0x40000000;
        local_78[local_108 - 1].mScore = -0x40000000;
        local_78[local_108 - 1].mIsTerminal = false;
      }
      uVar10 = local_108;
      if (uVar16 < local_108) {
        iVar18 = -0x40000000;
        uVar19 = 0;
      }
      else {
        uVar11 = local_b0 - local_108;
        pGVar14 = local_78 + local_108;
        uVar16 = local_a0 - local_a8;
        if (local_64 == Forward) {
          uVar16 = local_f0 + local_a8;
        }
        local_120 = (local_f8->sequence)._M_dataplus._M_p;
        local_130 = (local_f8->sequence)._M_string_length;
        local_118 = (local_100->sequence)._M_dataplus._M_p;
        local_128 = (local_100->sequence)._M_string_length;
        bVar5 = local_a8 == local_e0 && local_39;
        uVar17 = (ulong)((uint)bVar5 * 8);
        local_b8 = uVar17 + 8;
        local_138 = (local_38->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>.
                    _M_impl.super__Vector_impl_data._M_start + local_110;
        iVar15 = -0x40000000;
        uVar19 = 0;
        iVar18 = -0x40000000;
        do {
          local_d8 = (ulong)bVar5;
          if (uVar10 != 0) {
            uVar7 = (local_b0 - 1) + uVar10;
            if (local_64 != Forward) {
              uVar7 = uVar11;
            }
            if ((local_130 <= uVar7) || (local_128 <= uVar16)) {
              local_60 = piVar3;
              __assert_fail("index >= 0 && index < sequence.size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/libnsearch/include/nsearch/Sequence.h"
                            ,0x32,
                            "char Sequence<Protein>::operator[](const size_t) const [Alphabet = Protein]"
                           );
            }
            local_3b = 3 < "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                           [(long)local_118[uVar16] + (long)local_120[uVar7] * 0x1a + 0x15];
            iVar15 = iVar12 + "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                              [(long)local_118[uVar16] + (long)local_120[uVar7] * 0x1a + 0x15];
          }
          if (iVar15 <= iVar18) {
            iVar15 = iVar18;
          }
          if (iVar15 <= pGVar14->mScore) {
            iVar15 = pGVar14->mScore;
          }
          iVar12 = piVar3[uVar10];
          piVar3[uVar10] = iVar15;
          CVar6 = Insertion;
          if (((iVar15 != iVar18) && (CVar6 = Deletion, iVar15 != pGVar14->mScore)) &&
             (CVar6 = Mismatch, (local_3b & 1) != 0)) {
            CVar6 = Match;
          }
          local_138[uVar10] = CVar6;
          bVar21 = (local_c0 == uVar10 || uVar10 == 0) && local_3a;
          iVar8 = *(int *)((long)&(local_38->mParams).interiorGapOpenScore + uVar17) + iVar15 +
                  *(int *)((long)&(local_38->mParams).interiorGapExtendScore + uVar17);
          iVar20 = iVar18 + (&(local_38->mParams).interiorGapExtendScore)[(ulong)uVar19 * 2];
          iVar18 = iVar20;
          if (iVar20 < iVar8) {
            iVar18 = iVar8;
          }
          local_d8._0_4_ = (uint)bVar5;
          if (iVar20 < iVar8) {
            uVar19 = (uint)local_d8;
          }
          pBVar4 = pGVar14->mParams;
          uVar7 = (ulong)bVar21;
          iVar8 = (&pBVar4->interiorGapOpenScore)[uVar7 * 2] + iVar15 +
                  (&pBVar4->interiorGapExtendScore)[uVar7 * 2];
          iVar20 = pGVar14->mScore +
                   (&pBVar4->interiorGapExtendScore)[(ulong)pGVar14->mIsTerminal * 2];
          pGVar14->mScore = iVar20;
          if (iVar20 < iVar8) {
            pGVar14->mScore = iVar8;
            pGVar14->mIsTerminal = bVar21;
          }
          uVar10 = uVar10 + 1;
          uVar11 = uVar11 - 1;
          pGVar14 = pGVar14 + 1;
        } while (uVar10 <= local_48);
      }
      uVar16 = local_48 + 1;
      if (uVar16 < local_50) {
        piVar3[local_48 + 1] = -0x40000000;
        local_78[uVar16].mScore = -0x40000000;
        local_78[uVar16].mIsTerminal = false;
      }
      uVar16 = local_a8 + 1;
    } while ((uVar16 < local_70) && (uVar11 = local_110 + local_50, local_48 != local_108));
  }
  local_60 = piVar3;
  if (local_58 != (deque<CigarEntry,_std::allocator<CigarEntry>_> *)0x0) {
    uVar11 = uVar10 - 1;
    lVar9 = uVar16 - 1;
    local_a8 = uVar16;
    std::deque<CigarEntry,_std::allocator<CigarEntry>_>::clear(local_58);
    if (uVar11 != 0 || lVar9 != 0) {
      do {
        CVar6 = (local_38->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar11 + lVar9 * local_50];
        local_98.
        super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
        _M_impl.super__Vector_impl_data._M_start._0_5_ = CONCAT14(CVar6,1);
        local_48 = uVar11;
        Cigar::Add((Cigar *)local_58,(CigarEntry *)&local_98);
        uVar11 = local_48;
        if (CVar6 < Insertion) {
          if (CVar6 == Match) {
LAB_00160ecb:
            lVar9 = lVar9 + -1;
            uVar11 = local_48 - 1;
          }
          else if (CVar6 == Deletion) {
            lVar9 = lVar9 + -1;
          }
        }
        else {
          if (CVar6 == Mismatch) goto LAB_00160ecb;
          if (CVar6 == Insertion) {
            uVar11 = local_48 - 1;
          }
        }
      } while (uVar11 != 0 || lVar9 != 0);
    }
    Cigar::Reverse((Cigar *)local_58);
    uVar16 = local_a8;
  }
  iVar12 = (local_38->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar10 - 1];
  if (local_50 == uVar10) {
    lVar9 = uVar10 - 1;
    length = local_70 - uVar16;
    pGVar14 = (local_38->mVerticalGaps).
              super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
              ._M_impl.super__Vector_impl_data._M_start;
    Gap::OpenOrExtend(pGVar14 + lVar9,iVar12,pGVar14[lVar9].mIsTerminal,length);
    iVar12 = pGVar14[lVar9].mScore;
    this_00 = local_58;
    if ((local_58 == (deque<CigarEntry,_std::allocator<CigarEntry>_> *)0x0) || (local_70 == uVar16))
    goto LAB_00160fd7;
    local_98.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_start._0_5_ = CONCAT14(Deletion,(int)length);
  }
  else {
    this_00 = local_58;
    if (local_70 != uVar16) goto LAB_00160fd7;
    iVar15 = (int)(local_50 - uVar10);
    if (local_50 - uVar10 != 0) {
      iVar12 = iVar12 + (&(local_38->mParams).interiorGapOpenScore)[(ulong)uVar19 * 2] +
               (&(local_38->mParams).interiorGapExtendScore)[(ulong)uVar19 * 2] * iVar15;
    }
    iVar18 = (&(local_38->mParams).interiorGapExtendScore)[(ulong)uVar19 * 2] * iVar15 + iVar18;
    if (iVar18 < iVar12) {
      iVar18 = iVar12;
    }
    iVar12 = iVar18;
    if ((local_58 == (deque<CigarEntry,_std::allocator<CigarEntry>_> *)0x0) || (local_50 == uVar10))
    goto LAB_00160fd7;
    local_98.
    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>.
    _M_impl.super__Vector_impl_data._M_start._0_5_ = CONCAT14(Insertion,iVar15);
  }
  this_00 = local_58;
  Cigar::Add((Cigar *)local_58,(CigarEntry *)&local_98);
LAB_00160fd7:
  if (local_64 == Reverse && this_00 != (deque<CigarEntry,_std::allocator<CigarEntry>_> *)0x0) {
    Cigar::Reverse((Cigar *)this_00);
  }
  return iVar12;
}

Assistant:

int Align( const Sequence< Alphabet >& A, const Sequence< Alphabet >& B,
             Cigar*                   cigar = NULL,
             const AlignmentDirection dir   = AlignmentDirection::Forward,
             size_t startA = 0, size_t startB = 0, size_t endA = -1,
             size_t endB = -1 ) {
    // Calculate matrix width, depending on alignment
    // direction and length of sequences
    // A will be on the X axis (width of matrix)
    // B will be on the Y axis (height of matrix)
    size_t width, height;

    size_t lenA = A.Length();
    size_t lenB = B.Length();

    if( endA == ( size_t ) -1 ) {
      endA = ( dir == AlignmentDirection::Forward ? lenA : 0 );
    }

    if( endB == ( size_t ) -1 ) {
      endB = ( dir == AlignmentDirection::Forward ? lenB : 0 );
    }

    if( startA > lenA )
      startA = lenA;
    if( startB > lenB )
      startB = lenB;
    if( endA > lenA )
      endA = lenA;
    if( endB > lenB )
      endB = lenB;

    width  = ( endA > startA ? endA - startA : startA - endA ) + 1;
    height = ( endB > startB ? endB - startB : startB - endB ) + 1;

    // Make sure we have enough cells
    if( mScores.capacity() < width ) {
      mScores = Scores( width * 1.5, MinInt() );
    }

    if( mVerticalGaps.capacity() < width ) {
      mVerticalGaps = Gaps( width * 1.5, mParams );
    }

    if( mOperations.capacity() < width * height ) {
      mOperations = CigarOps( width * height * 1.5 );
    }

    // Initialize first row
    size_t bw = mParams.bandwidth;

    bool fromBeginningA = ( startA == 0 || startA == lenA );
    bool fromBeginningB = ( startB == 0 || startB == lenB );

    bool fromEndA = ( endA == 0 || endA == lenA );
    bool fromEndB = ( endB == 0 || endB == lenB );

    mScores[ 0 ] = 0;

    mVerticalGaps[ 0 ].Reset();
    mVerticalGaps[ 0 ].OpenOrExtend( mScores[ 0 ], fromBeginningB );

    Gap horizontalGap( mParams );

    size_t x, y;
    for( x = 1; x < width; x++ ) {
      if( x > bw && height > 1 ) // only break on BW bound if B is not empty
        break;

      horizontalGap.OpenOrExtend( mScores[ x - 1 ], fromBeginningA );
      mScores[ x ]     = horizontalGap.Score();
      mOperations[ x ] = CigarOp::Insertion;
      mVerticalGaps[ x ].Reset();
    }
    if( x < width ) {
      mScores[ x ] = MinInt();
      mVerticalGaps[ x ].Reset();
    }
    /* PrintRow( width ); */

    // Row by row...
    size_t center = 1;
    bool   hitEnd = false;
    for( y = 1; y < height && !hitEnd; y++ ) {
      int score = MinInt();

      // Calculate band bounds
      size_t leftBound =
        std::min( center > bw ? ( center - bw ) : 0, width - 1 );
      size_t rightBound = std::min( center + bw, width - 1 );

      // Set diagonal score for first calculated cell in row
      int diagScore = MinInt();
      if( leftBound > 0 ) {
        diagScore                = mScores[ leftBound - 1 ];
        mScores[ leftBound - 1 ] = MinInt();
        mVerticalGaps[ leftBound - 1 ].Reset();
      }

      // Calculate row within the band bounds
      horizontalGap.Reset();
      for( x = leftBound; x <= rightBound; x++ ) {
        // Calculate diagonal score
        size_t aIdx = 0, bIdx = 0;
        bool   match;
        if( x > 0 ) {
          aIdx =
            ( dir == AlignmentDirection::Forward ) ? startA + x - 1 : startA - x;
          bIdx =
            ( dir == AlignmentDirection::Forward ) ? startB + y - 1 : startB - y;
          // diagScore: score at col-1, row-1
          match = MatchPolicy< Alphabet >::Match( A[ aIdx ], B[ bIdx ] );
          score = diagScore + ScorePolicy< Alphabet >::Score( A[ aIdx ], B[ bIdx ] );
        }

        // Select highest score
        //  - coming from diag (current),
        //  - coming from left (row)
        //  - coming from top (col)
        if( score < horizontalGap.Score() )
          score = horizontalGap.Score();

        Gap& verticalGap = mVerticalGaps[ x ];
        if( score < verticalGap.Score() )
          score = verticalGap.Score();

        // Save the prev score at (x - 1) which
        // we will use to compute the diagonal score at (x)
        diagScore = mScores[ x ];

        // Save new score
        mScores[ x ] = score;

        CigarOp op;
        if( score == horizontalGap.Score() ) {
          op = CigarOp::Insertion;
        } else if( score == verticalGap.Score() ) {
          op = CigarOp::Deletion;
        } else {
          op = match ? CigarOp::Match : CigarOp::Mismatch;
        }
        mOperations[ y * width + x ] = op;

        // Calculate potential gaps
        bool isTerminalA = ( x == 0 || x == width - 1 ) && fromEndA;
        bool isTerminalB = ( y == 0 || y == height - 1 ) && fromEndB;

        horizontalGap.OpenOrExtend( score, isTerminalB );
        verticalGap.OpenOrExtend( score, isTerminalA );
      }

      if( rightBound + 1 < width ) {
        mScores[ rightBound + 1 ] = MinInt();
        mVerticalGaps[ rightBound + 1 ].Reset();
      }

      hitEnd = ( rightBound == leftBound );

      /* PrintRow( width ); */

      // Move one cell over for the next row
      center++;
    }

    // Backtrack
    if( cigar ) {
      size_t bx = x - 1;
      size_t by = y - 1;

      CigarEntry ce;
      cigar->Clear();
      while( bx != 0 || by != 0 ) {
        CigarOp op = mOperations[ by * width + bx ];
        cigar->Add( op );

        switch( op ) {
          case CigarOp::Insertion:
            bx--;
            break;
          case CigarOp::Deletion:
            by--;
            break;
          case CigarOp::Match:
            bx--;
            by--;
            break;
          case CigarOp::Mismatch:
            bx--;
            by--;
            break;
          default:
            assert( true );
            break;
        }
      }

      cigar->Reverse();
    }

    // Calculate score & cut corners
    int score = mScores[ x - 1 ];
    if( x == width ) {
      // We reached the end of A, emulate going down on B (vertical gaps)
      size_t remainingB  = height - y;
      Gap&   verticalGap = mVerticalGaps[ x - 1 ];
      verticalGap.OpenOrExtend( score, verticalGap.IsTerminal(), remainingB );
      score = verticalGap.Score();

      // Add tails to backtrack info
      if( cigar && remainingB ) {
        cigar->Add( CigarEntry( remainingB, CigarOp::Deletion ) );
      }
    } else if( y == height ) {
      // We reached the end of B, emulate going down on A (horizontal gaps)
      size_t remainingA = width - x;
      horizontalGap.OpenOrExtend( score, horizontalGap.IsTerminal(),
                                  remainingA );
      score = horizontalGap.Score();

      // Add tails to backtrack info
      if( cigar && remainingA ) {
        cigar->Add( CigarEntry( remainingA, CigarOp::Insertion ) );
      }
    }

    if( cigar && dir == AlignmentDirection::Reverse ) {
      cigar->Reverse();
    }

    return score;
  }